

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
JsDeletePropertyCommon
          (ScriptContext *scriptContext,JsValueRef object,PropertyRecord *propertyRecord,
          bool useStrictRules,JsValueRef *result)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Var instance;
  undefined7 extraout_var;
  
  if (scriptContext->threadContext->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x71d,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "Caller is expected to be under ContextAPIWrapper!");
    if (!bVar2) goto LAB_003874a4;
    *puVar4 = 0;
  }
  instance = Js::JavascriptOperators::OP_DeleteProperty
                       (object,propertyRecord->pid,scriptContext,(uint)useStrictRules);
  *result = instance;
  if (instance != (Var)0x0) {
    uVar3 = Js::CrossSite::NeedMarshalVar(instance,scriptContext);
    instance = (Var)(ulong)uVar3;
    if (uVar3 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                         ,0x723,
                         "(*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext))"
                         ,
                         "*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext)"
                        );
      instance = (Var)CONCAT71(extraout_var,bVar2);
      if (!bVar2) {
LAB_003874a4:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return (JsErrorCode)instance;
}

Assistant:

static JsErrorCode JsDeletePropertyCommon(Js::ScriptContext * scriptContext, _In_ JsValueRef object,
    _In_ const Js::PropertyRecord * propertyRecord, _In_ bool useStrictRules, _Out_ JsValueRef *result)
{
    AssertMsg(scriptContext->GetThreadContext()->IsScriptActive(), "Caller is expected to be under ContextAPIWrapper!");

    *result = Js::JavascriptOperators::OP_DeleteProperty((Js::Var)object,
        propertyRecord->GetPropertyId(),
        scriptContext, useStrictRules ? Js::PropertyOperation_StrictMode : Js::PropertyOperation_None);

    Assert(*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext));

    return JsNoError;
}